

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O0

appender __thiscall
fmt::v9::detail::printf_arg_formatter<fmt::v9::appender,_char>::write_null_pointer
          (printf_arg_formatter<fmt::v9::appender,_char> *this,bool is_string)

{
  undefined8 uVar1;
  string_view bytes;
  appender aVar2;
  undefined1 in_SIL;
  undefined8 *in_RDI;
  basic_format_specs<char> s;
  basic_format_specs<char> *specs;
  undefined4 in_stack_ffffffffffffffc8;
  undefined8 uVar3;
  int iVar4;
  undefined4 uVar5;
  undefined3 in_stack_ffffffffffffffdc;
  uint uVar6;
  
  uVar6 = CONCAT13(in_SIL,in_stack_ffffffffffffffdc) & 0x1ffffff;
  uVar3 = *(undefined8 *)in_RDI[1];
  uVar1 = ((undefined8 *)in_RDI[1])[1];
  uVar5 = (undefined4)((ulong)uVar1 >> 0x20);
  iVar4 = (uint)(uint3)((ulong)uVar1 >> 8) << 8;
  specs = (basic_format_specs<char> *)*in_RDI;
  std::char_traits<char>::length((char_type *)0x53b76c);
  aVar2.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container._4_4_ = uVar6;
  aVar2.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container._0_4_ = uVar5;
  bytes._4_8_ = uVar3;
  bytes.data_._0_4_ = in_stack_ffffffffffffffc8;
  bytes.size_._4_4_ = iVar4;
  aVar2 = write_bytes<(fmt::v9::align::type)1,char,fmt::v9::appender>(aVar2,bytes,specs);
  return (appender)
         aVar2.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write_null_pointer(bool is_string = false) {
    auto s = this->specs;
    s.type = presentation_type::none;
    return write_bytes(this->out, is_string ? "(null)" : "(nil)", s);
  }